

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void m68k_tr_tb_stop(DisasContextBase_conflict1 *dcbase,CPUState *cpu)

{
  TCGContext_conflict2 *tcg_ctx_00;
  uint uVar1;
  TCGContext_conflict2 *tcg_ctx;
  DisasContextBase_conflict1 *__mptr;
  DisasContext_conflict2 *dc;
  CPUState *cpu_local;
  DisasContextBase_conflict1 *dcbase_local;
  
  tcg_ctx_00 = *(TCGContext_conflict2 **)(*(long *)&dcbase[6].is_jmp + 0x2e8);
  uVar1 = dcbase->is_jmp - DISAS_TOO_MANY;
  if (2 < uVar1 && dcbase->is_jmp != DISAS_TARGET_1) {
    g_assertion_message_expr
              ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/m68k/translate.c"
               ,0x190d,(char *)0x0);
  }
  switch((long)&switchD_008d75f8::switchdataD_0138259c +
         (long)(int)(&switchD_008d75f8::switchdataD_0138259c)[uVar1]) {
  case 0x8d75fa:
    break;
  case 0x8d75ff:
    update_cc_op((DisasContext_conflict2 *)dcbase);
    if ((dcbase->singlestep_enabled & 1U) == 0) {
      gen_jmp_tb((DisasContext_conflict2 *)dcbase,0,dcbase[1].pc_first);
    }
    else {
      tcg_gen_movi_i32(tcg_ctx_00,QREG_PC,dcbase[1].pc_first);
      gen_raise_exception(tcg_ctx_00,0x10002);
    }
    break;
  case 0x8d764d:
    if ((dcbase->singlestep_enabled & 1U) == 0) {
      tcg_gen_lookup_and_goto_ptr_m68k(tcg_ctx_00);
    }
    else {
      gen_raise_exception(tcg_ctx_00,0x10002);
    }
    break;
  case 0x8d7672:
    if ((dcbase->singlestep_enabled & 1U) == 0) {
      tcg_gen_exit_tb_m68k(tcg_ctx_00,(TranslationBlock *)0x0,0);
    }
    else {
      gen_raise_exception(tcg_ctx_00,0x10002);
    }
  }
  return;
}

Assistant:

static void m68k_tr_tb_stop(DisasContextBase *dcbase, CPUState *cpu)
{
    DisasContext *dc = container_of(dcbase, DisasContext, base);
    TCGContext *tcg_ctx = dc->uc->tcg_ctx;

    switch (dc->base.is_jmp) {
    case DISAS_NORETURN:
        break;
    case DISAS_TOO_MANY:
        update_cc_op(dc);
        if (dc->base.singlestep_enabled) {
            tcg_gen_movi_i32(tcg_ctx, QREG_PC, dc->pc);
            gen_raise_exception(tcg_ctx, EXCP_DEBUG);
        } else {
            gen_jmp_tb(dc, 0, dc->pc);
        }
        break;
    case DISAS_JUMP:
        /* We updated CC_OP and PC in gen_jmp/gen_jmp_im.  */
        if (dc->base.singlestep_enabled) {
            gen_raise_exception(tcg_ctx, EXCP_DEBUG);
        } else {
            tcg_gen_lookup_and_goto_ptr(tcg_ctx);
        }
        break;
    case DISAS_EXIT:
        /*
         * We updated CC_OP and PC in gen_exit_tb, but also modified
         * other state that may require returning to the main loop.
         */
        if (dc->base.singlestep_enabled) {
            gen_raise_exception(tcg_ctx, EXCP_DEBUG);
        } else {
            tcg_gen_exit_tb(tcg_ctx, NULL, 0);
        }
        break;
    default:
        g_assert_not_reached();
    }
}